

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lys_array_add_mod_ref(lysc_ctx *ctx,lys_module *mod,lys_module ***mod_array)

{
  lys_module **pplVar1;
  lys_module **pplVar2;
  lys_module *plVar3;
  long *plVar4;
  long lVar5;
  lys_module *plVar6;
  LY_ERR LVar7;
  
  pplVar2 = *mod_array;
  if (pplVar2 == (lys_module **)0x0) {
    plVar4 = (long *)malloc(0x10);
    if (plVar4 == (long *)0x0) {
LAB_0014ff70:
      LVar7 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_array_add_mod_ref");
    }
    else {
      *plVar4 = 1;
      lVar5 = 1;
LAB_0014ff5a:
      *mod_array = (lys_module **)(plVar4 + 1);
      plVar4[lVar5] = (long)mod;
      LVar7 = LY_SUCCESS;
    }
  }
  else {
    plVar3 = pplVar2[-1];
    LVar7 = LY_EEXIST;
    plVar6 = (lys_module *)0x0;
    do {
      if (plVar3 == plVar6) {
        pplVar2[-1] = (lys_module *)((long)&plVar3->ctx + 1);
        plVar4 = (long *)realloc(pplVar2 + -1,(long)plVar3 * 8 + 0x10);
        if (plVar4 == (long *)0x0) {
          (*mod_array)[-1] = (lys_module *)&(*mod_array)[-1][-1].field_0x7f;
          goto LAB_0014ff70;
        }
        lVar5 = *plVar4;
        goto LAB_0014ff5a;
      }
      pplVar1 = pplVar2 + (long)plVar6;
      plVar6 = (lys_module *)((long)&plVar6->ctx + 1);
    } while (*pplVar1 != mod);
  }
  return LVar7;
}

Assistant:

static LY_ERR
lys_array_add_mod_ref(struct lysc_ctx *ctx, struct lys_module *mod, struct lys_module ***mod_array)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lys_module **new_mod;

    LY_ARRAY_FOR(*mod_array, u) {
        if ((*mod_array)[u] == mod) {
            /* already there */
            return LY_EEXIST;
        }
    }

    /* add the new module ref */
    LY_ARRAY_NEW_RET(ctx->ctx, *mod_array, new_mod, LY_EMEM);
    *new_mod = mod;

    return LY_SUCCESS;
}